

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzmatrix.cpp
# Opt level: O2

Fad<float> * __thiscall
TPZMatrix<Fad<float>_>::MatrixNorm
          (Fad<float> *__return_storage_ptr__,TPZMatrix<Fad<float>_> *this,int p,int64_t numiter,
          REAL tol)

{
  long rows;
  bool bVar1;
  ostream *poVar2;
  Fad<float> *pFVar3;
  long lVar4;
  long lVar5;
  long lVar6;
  long lVar7;
  REAL sum;
  TPZVec<Fad<float>_> EigenVal;
  TPZVec<Fad<float>_> ROW;
  TPZFMatrix<Fad<float>_> transp;
  undefined1 local_158 [24];
  float local_140;
  long local_130;
  REAL local_128;
  int64_t local_120;
  long local_118;
  TPZVec<Fad<float>_> local_110;
  FadExpr<FadBinaryMul<Fad<float>,_Fad<float>_>_> local_f0;
  TPZVec<Fad<float>_> local_e0;
  float local_c0 [36];
  
  rows = (this->super_TPZBaseMatrix).fRow;
  if (rows == 0) {
    __return_storage_ptr__->val_ = 0.0;
    (__return_storage_ptr__->dx_).num_elts = 0;
    (__return_storage_ptr__->dx_).ptr_to_data = (float *)0x0;
    __return_storage_ptr__->defaultVal = 0.0;
  }
  else {
    local_128 = tol;
    local_120 = numiter;
    if (rows != (this->super_TPZBaseMatrix).fCol) {
      poVar2 = std::operator<<((ostream *)&std::cerr,
                               "TVar TPZMatrix<Fad<float>>::MatrixNorm(int, int64_t, REAL) const [T = Fad<float>]"
                              );
      poVar2 = std::operator<<(poVar2," - matrix must be square - Rows() = ");
      poVar2 = std::ostream::_M_insert<long>((long)poVar2);
      poVar2 = std::operator<<(poVar2," - Cols() = ");
      poVar2 = std::ostream::_M_insert<long>((long)poVar2);
      std::endl<char,std::char_traits<char>>(poVar2);
    }
    if (p == 2) {
      TPZFMatrix<Fad<float>_>::TPZFMatrix((TPZFMatrix<Fad<float>_> *)local_c0,rows,rows);
      lVar5 = 0;
      local_130 = 0;
      if (0 < rows) {
        local_130 = rows;
      }
      for (; lVar5 != local_130; lVar5 = lVar5 + 1) {
        for (lVar4 = 0; rows != lVar4; lVar4 = lVar4 + 1) {
          (*(this->super_TPZBaseMatrix).super_TPZSavable._vptr_TPZSavable[0x21])
                    ((Fad<float> *)local_158,this,lVar4,lVar5);
          pFVar3 = TPZFMatrix<Fad<float>_>::operator()
                             ((TPZFMatrix<Fad<float>_> *)local_c0,lVar5,lVar4);
          Fad<float>::operator=(pFVar3,(Fad<float> *)local_158);
          Fad<float>::~Fad((Fad<float> *)local_158);
        }
      }
      TPZVec<Fad<float>_>::TPZVec(&local_e0,rows);
      for (lVar5 = 0; lVar5 != local_130; lVar5 = lVar5 + 1) {
        lVar4 = 0;
        for (lVar6 = 0; rows != lVar6; lVar6 = lVar6 + 1) {
          pFVar3 = TPZFMatrix<Fad<float>_>::operator()
                             ((TPZFMatrix<Fad<float>_> *)local_c0,lVar5,lVar6);
          Fad<float>::operator=((Fad<float> *)((long)&(local_e0.fStore)->val_ + lVar4),pFVar3);
          lVar4 = lVar4 + 0x20;
        }
        local_118 = lVar5;
        for (lVar4 = 0; lVar4 != rows; lVar4 = lVar4 + 1) {
          local_158._0_8_ = local_158._0_8_ & 0xffffffff00000000;
          local_158._8_4_ = 0.0;
          local_158._16_8_ = (float *)0x0;
          local_140 = 0.0;
          lVar6 = 0;
          for (lVar7 = 0; pFVar3 = local_e0.fStore, lVar5 = local_118, rows != lVar7;
              lVar7 = lVar7 + 1) {
            (*(this->super_TPZBaseMatrix).super_TPZSavable._vptr_TPZSavable[0x21])
                      (&local_110,this,lVar7,lVar4);
            local_f0.fadexpr_.left_ = (Fad<float> *)((long)&pFVar3->val_ + lVar6);
            local_f0.fadexpr_.right_ = (Fad<float> *)&local_110;
            Fad<float>::operator+=((Fad<float> *)local_158,&local_f0);
            Fad<float>::~Fad((Fad<float> *)&local_110);
            lVar6 = lVar6 + 0x20;
          }
          pFVar3 = TPZFMatrix<Fad<float>_>::operator()
                             ((TPZFMatrix<Fad<float>_> *)local_c0,local_118,lVar4);
          Fad<float>::operator=(pFVar3,(Fad<float> *)local_158);
          Fad<float>::~Fad((Fad<float> *)local_158);
        }
      }
      local_110._vptr_TPZVec = (_func_int **)&PTR__TPZVec_01655c20;
      local_110.fStore = (Fad<float> *)0x0;
      local_110.fNElements = 0;
      local_110.fNAlloc = 0;
      bVar1 = SolveEigenvaluesJacobi
                        ((TPZMatrix<Fad<float>_> *)local_c0,&local_120,&local_128,&local_110);
      if (!bVar1) {
        poVar2 = std::operator<<((ostream *)&std::cerr,
                                 "TVar TPZMatrix<Fad<float>>::MatrixNorm(int, int64_t, REAL) const [T = Fad<float>]"
                                );
        poVar2 = std::operator<<(poVar2," - it was not possible to find Eigenvalues. Iterations = ")
        ;
        poVar2 = std::ostream::_M_insert<long>((long)poVar2);
        std::operator<<(poVar2," - error found = ");
        poVar2 = std::ostream::_M_insert<double>(local_128);
        std::endl<char,std::char_traits<char>>(poVar2);
      }
      sqrt<float>((FadExpr<FadFuncSqrt<Fad<float>_>_> *)local_158,local_110.fStore);
      Fad<float>::Fad<FadFuncSqrt<Fad<float>>>
                (__return_storage_ptr__,(FadExpr<FadFuncSqrt<Fad<float>_>_> *)local_158);
      Fad<float>::~Fad((Fad<float> *)(local_158 + 8));
      TPZVec<Fad<float>_>::~TPZVec(&local_110);
      TPZVec<Fad<float>_>::~TPZVec(&local_e0);
      TPZFMatrix<Fad<float>_>::~TPZFMatrix((TPZFMatrix<Fad<float>_> *)local_c0);
    }
    else if (p == 1) {
      __return_storage_ptr__->val_ = 0.0;
      (__return_storage_ptr__->dx_).num_elts = 0;
      (__return_storage_ptr__->dx_).ptr_to_data = (float *)0x0;
      __return_storage_ptr__->defaultVal = 0.0;
      lVar4 = 0;
      lVar5 = 0;
      if (0 < rows) {
        lVar5 = rows;
      }
      for (; lVar4 != lVar5; lVar4 = lVar4 + 1) {
        local_158._0_8_ = 0.0;
        for (lVar6 = 0; rows != lVar6; lVar6 = lVar6 + 1) {
          (*(this->super_TPZBaseMatrix).super_TPZSavable._vptr_TPZSavable[0x21])
                    ((Fad<float> *)local_c0,this,lVar6,lVar4);
          local_158._0_8_ = (double)ABS(local_c0[0]) + (double)local_158._0_8_;
          Fad<float>::~Fad((Fad<float> *)local_c0);
        }
        if ((double)ABS(__return_storage_ptr__->val_) < (double)local_158._0_8_) {
          Fad<float>::operator=<double,_nullptr>(__return_storage_ptr__,(double *)local_158);
        }
      }
    }
    else if (p == 0) {
      __return_storage_ptr__->val_ = 0.0;
      (__return_storage_ptr__->dx_).num_elts = 0;
      (__return_storage_ptr__->dx_).ptr_to_data = (float *)0x0;
      __return_storage_ptr__->defaultVal = 0.0;
      lVar4 = 0;
      lVar5 = 0;
      if (0 < rows) {
        lVar5 = rows;
      }
      for (; lVar4 != lVar5; lVar4 = lVar4 + 1) {
        local_158._0_8_ = 0.0;
        for (lVar6 = 0; rows != lVar6; lVar6 = lVar6 + 1) {
          (*(this->super_TPZBaseMatrix).super_TPZSavable._vptr_TPZSavable[0x21])
                    ((Fad<float> *)local_c0,this,lVar4,lVar6);
          local_158._0_8_ = (double)ABS(local_c0[0]) + (double)local_158._0_8_;
          Fad<float>::~Fad((Fad<float> *)local_c0);
        }
        if ((double)ABS(__return_storage_ptr__->val_) < (double)local_158._0_8_) {
          Fad<float>::operator=<double,_nullptr>(__return_storage_ptr__,(double *)local_158);
        }
      }
    }
    else {
      poVar2 = std::operator<<((ostream *)&std::cerr,
                               "TVar TPZMatrix<Fad<float>>::MatrixNorm(int, int64_t, REAL) const [T = Fad<float>]"
                              );
      poVar2 = std::operator<<(poVar2," p = ");
      poVar2 = (ostream *)std::ostream::operator<<(poVar2,p);
      poVar2 = std::operator<<(poVar2," is not a correct option");
      std::endl<char,std::char_traits<char>>(poVar2);
      __return_storage_ptr__->val_ = 0.0;
      (__return_storage_ptr__->dx_).num_elts = 0;
      (__return_storage_ptr__->dx_).ptr_to_data = (float *)0x0;
      __return_storage_ptr__->defaultVal = 0.0;
    }
  }
  return __return_storage_ptr__;
}

Assistant:

TVar TPZMatrix<TVar>::MatrixNorm(int p, int64_t numiter, REAL tol) const{
	const int64_t n = this->Rows();
	if (!n) return 0.;
	if (n != this->Cols()){
		PZError << __PRETTY_FUNCTION__
		<< " - matrix must be square - Rows() = "
		<< this->Rows() << " - Cols() = "
		<< this->Cols() << std::endl;
	}
	switch(p){
		case 0:{
			TVar max = 0.;
			int64_t i, j;
			for(i = 0; i < n; i++){
				REAL sum = 0.;
				for(j = 0; j < n; j++) sum += fabs( this->Get(i,j) );
				if (sum > fabs(max)) max = sum;
			}
			return max;
		}
		case 1:{
			TVar max = 0.;
			int64_t i, j;
			for(i = 0; i < n; i++){
				REAL sum = 0.;
				for(j = 0; j < n; j++) sum += fabs( this->Get(j,i) );
				if (sum > fabs(max)) max = sum;
			}
			return max;
		}
		case 2:{
			TPZFMatrix<TVar> transp(n,n);
			int64_t i, j, k;
			//TRANSPOSE
			for(i = 0; i < n; i++) for(j = 0; j < n; j++) transp(i,j) = this->Get(j,i);
			//MULTIPLY transp = transp.this
			TPZVec<TVar> ROW(n);
			for(i = 0; i < n; i++){
				for(j = 0; j < n; j++) ROW[j] = transp(i,j);
				for(j = 0; j < n; j++){
					TVar sum = 0.;
					for(k = 0; k < n; k++){
						sum += ROW[k] * this->Get(k,j);
					}//for k
					transp(i,j) = sum;
				}//for j
			}//for i
			
			TPZVec<TVar> EigenVal;
			bool result = transp.SolveEigenvaluesJacobi(numiter, tol, &EigenVal);
			if (result == false) PZError << __PRETTY_FUNCTION__
				<< " - it was not possible to find Eigenvalues. Iterations = "
				<< numiter << " - error found = " << tol << std::endl;
			return sqrt(EigenVal[0]);
		}//case 2
		default:{
			PZError << __PRETTY_FUNCTION__ << " p = " << p << " is not a correct option" << std::endl;
		}
	}//switch
	return 0.;
}